

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

cppcms_capi_cookie * cppcms_capi_session_cookie_next(cppcms_capi_session *session)

{
  _Base_ptr p_Var1;
  cppcms_capi_cookie *this;
  
  if (session != (cppcms_capi_session *)0x0) {
    cppcms_capi_session::check_saved(session);
    p_Var1 = (session->adapter).cookies_ptr._M_node;
    if ((_Rb_tree_header *)p_Var1 != &(session->adapter).cookies._M_t._M_impl.super__Rb_tree_header)
    {
      this = (cppcms_capi_cookie *)operator_new(0x148);
      cppcms_capi_cookie::cppcms_capi_cookie(this,(cookie *)(p_Var1 + 2));
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>
      ::operator++(&(session->adapter).cookies_ptr);
      return this;
    }
  }
  return (cppcms_capi_cookie *)0x0;
}

Assistant:

cppcms_capi_cookie *cppcms_capi_session_cookie_next(cppcms_capi_session *session)
{
	TRY {
		if(!session)
			return 0;
		session->check_saved();
		if(session->adapter.cookies_ptr == session->adapter.cookies.end())
			return 0;
		cppcms_capi_cookie *r=new cppcms_capi_cookie(session->adapter.cookies_ptr->second);
		++session->adapter.cookies_ptr;
		return r;
	}